

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::ByteSizeLong
          (CustomModel_CustomModelParamValue *this)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  
  uVar1 = this->_oneof_case_[0];
  sVar5 = 0;
  if ((int)uVar1 < 0x28) {
    if (uVar1 == 10) {
      sVar5 = 9;
      goto LAB_0031f6fd;
    }
    if (uVar1 == 0x14) goto LAB_0031f6b0;
    if (uVar1 != 0x1e) goto LAB_0031f6fd;
    uVar4 = (ulong)(this->value_).intvalue_;
  }
  else {
    if (uVar1 != 0x28) {
      if (uVar1 == 0x32) {
        sVar5 = 3;
        goto LAB_0031f6fd;
      }
      if (uVar1 != 0x3c) goto LAB_0031f6fd;
LAB_0031f6b0:
      lVar3 = *(long *)(((this->value_).longvalue_ & 0xfffffffffffffffeU) + 8);
      uVar6 = (uint)lVar3 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = lVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
      goto LAB_0031f6fd;
    }
    uVar4 = (this->value_).longvalue_;
  }
  lVar3 = 0x3f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
LAB_0031f6fd:
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

inline CustomModel_CustomModelParamValue::ValueCase CustomModel_CustomModelParamValue::value_case() const {
  return CustomModel_CustomModelParamValue::ValueCase(_oneof_case_[0]);
}